

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

istream * operator>>(istream *stream,BupHeader *header)

{
  pointer pBVar1;
  pointer src;
  BupHeader *pBVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t len;
  pointer pBVar6;
  BupChunk *chunk;
  pointer pBVar7;
  BupChunk *mouth;
  ulong uVar8;
  vector<char,_std::allocator<char>_> nameBuf;
  endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> t_1;
  BupChunkV4 t_6;
  BupHeaderV4 h;
  vector<char,_std::allocator<char>_> local_d8;
  BupChunk local_b8 [4];
  uint32_t local_a8;
  uint local_9c;
  BupHeader *local_98;
  string local_90;
  undefined1 local_70 [12];
  undefined8 local_64;
  
  iVar3 = detectSwitch(stream);
  if (iVar3 < 0) {
    readBup<BupHeaderPS3>(stream,header);
  }
  else if (iVar3 < 4) {
    readBup<BupHeaderSwitch>(stream,header);
  }
  else {
    header->isSwitch = true;
    std::istream::read((char *)stream,(long)local_70);
    header->ew = (undefined2)local_64;
    header->eh = local_64._2_2_;
    header->width = local_64._4_2_;
    header->height = local_64._6_2_;
    std::istream::read((char *)stream,(long)local_b8);
    std::vector<BupChunk,_std::allocator<BupChunk>_>::resize
              (&header->chunks,(ulong)local_b8[0].offset);
    pBVar7 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pBVar7 != pBVar1) {
      do {
        std::istream::read((char *)stream,(long)local_b8);
        pBVar7->offset = local_b8[0].offset;
        pBVar7 = pBVar7 + 1;
      } while (pBVar7 != pBVar1);
    }
    uVar4 = std::istream::tellg();
    if ((uVar4 & 0xf) != 0) {
      do {
        std::istream::read((char *)stream,(long)local_b8);
        if (local_b8[0].offset != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unexpected nonzero values in header",0x23);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
          std::ostream::put('\x18');
          std::ostream::flush();
        }
        uVar4 = std::istream::tellg();
      } while ((uVar4 & 0xf) != 0);
    }
    std::istream::read((char *)stream,(long)local_b8);
    std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::resize
              (&header->expChunks,(ulong)local_b8[0].offset);
    local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pBVar6 = (header->expChunks).
             super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((header->expChunks).
        super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
        super__Vector_impl_data._M_finish != pBVar6) {
      uVar4 = 0;
      local_98 = header;
      do {
        std::istream::read((char *)stream,(long)local_b8);
        pBVar6 = pBVar6 + uVar4;
        (pBVar6->face).offset = local_a8;
        uVar8 = (ulong)local_b8[0].offset;
        uVar5 = (ulong)local_9c;
        std::vector<char,_std::allocator<char>_>::resize(&local_d8,(uVar8 + uVar5 * -0xc) - 0x1f);
        local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8 + uVar5 * -0xc + -0x20] = '\0';
        std::istream::read((char *)stream,
                           (long)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        src = local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
        len = strlen(local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
        iconv_convert_abi_cxx11_(&local_90,src,len,iconv_toutf);
        std::__cxx11::string::operator=((string *)pBVar6,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint32_t)local_90._M_dataplus._M_p) !=
            &local_90.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                   (uint32_t)local_90._M_dataplus._M_p),
                          local_90.field_2._M_allocated_capacity + 1);
        }
        std::vector<BupChunk,_std::allocator<BupChunk>_>::resize(&pBVar6->mouths,(ulong)local_9c);
        pBVar2 = local_98;
        pBVar1 = (pBVar6->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pBVar7 = (pBVar6->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>.
                      _M_impl.super__Vector_impl_data._M_start; pBVar7 != pBVar1;
            pBVar7 = pBVar7 + 1) {
          std::istream::read((char *)stream,(long)&local_90);
          pBVar7->offset = (uint32_t)local_90._M_dataplus._M_p;
        }
        uVar4 = uVar4 + 1;
        pBVar6 = (pBVar2->expChunks).
                 super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl
                 .super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(pBVar2->expChunks).
                                     super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6 >> 6)
              );
    }
    if (local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return stream;
}

Assistant:

std::istream& operator>> (std::istream& stream, BupHeader &header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		readBup<BupHeaderPS3>(stream, header);
	} else if (version < 4) { // Switch Old
		readBup<BupHeaderSwitch>(stream, header);
	} else { // Switch New
		header.isSwitch = true;
		auto h = readRaw<BupHeaderV4>(stream);
		header.eh = h.eh.value();
		header.ew = h.ew.value();
		header.width = h.width.value();
		header.height = h.height.value();
		auto numChunks = readRaw<uint32_le>(stream);
		header.chunks.resize(numChunks.value());

		for (auto& chunk : header.chunks) {
			auto c = readRaw<BupChunkV4>(stream);
			copyTo(chunk, c);
		}

		while (stream.tellg() % 16 != 0) {
			auto t = readRaw<uint32_le>(stream);
			if (t.value() != 0) {
				std::cerr << "Unexpected nonzero values in header" << std::endl;
			}
		}

		auto numExpChunks = readRaw<uint32_le>(stream);
		header.expChunks.resize(numExpChunks.value());
		std::vector<char> nameBuf;

		for (size_t i = 0; i < header.expChunks.size(); i++) {
			auto& expChunk = header.expChunks[i];
			auto c = readRaw<BupExpressionChunkV4>(stream);
			copyTo(expChunk.face, c.face);
			auto namelen = c.headerLen.value() - sizeof(c) - c.numMouths.value() * sizeof(BupChunkV4);
			nameBuf.resize(namelen + 1);
			nameBuf[namelen] = 0;
			stream.read(nameBuf.data(), namelen);
			expChunk.name = toUTF8(nameBuf.data(), strlen(nameBuf.data()));

			expChunk.mouths.resize(c.numMouths.value());
			for (auto& mouth : expChunk.mouths) {
				auto m = readRaw<BupChunkV4>(stream);
				copyTo(mouth, m);
			}
		}
	}
	return stream;
}